

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cURLpp.cpp
# Opt level: O2

char * __thiscall curlpp::getenv(curlpp *this,char *__name)

{
  void *__ptr;
  RuntimeError *this_00;
  
  *(curlpp **)this = this + 0x10;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (curlpp)0x0;
  __ptr = (void *)curl_getenv(*(undefined8 *)__name);
  if (__ptr != (void *)0x0) {
    std::__cxx11::string::assign((char *)this);
    free(__ptr);
    return (char *)this;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x10);
  RuntimeError::RuntimeError(this_00,"unable to get the environnement string");
  __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::string
curlpp::getenv(const std::string & name)
{
   std::string buffer;
   char* p = curl_getenv(name.c_str());
   if (!p)
   {
      throw RuntimeError("unable to get the environnement string"); //we got an error
   }
   else
   {
      buffer = p;
      free(p);
   }
   return buffer;
}